

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

path * GetDefaultDataDir(void)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  path *in_RDI;
  long in_FS_OFFSET;
  char *pszHome;
  path pathRet;
  undefined7 in_stack_ffffffffffffff18;
  format in_stack_ffffffffffffff1f;
  path *in_stack_ffffffffffffff20;
  path *p1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  fs::path::path((path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  __s = getenv("HOME");
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    if (sVar2 != 0) {
      fs::path::path<char*,std::filesystem::__cxx11::path>
                (in_RDI,(char **)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
      fs::path::operator=(in_RDI,in_stack_ffffffffffffff20);
      fs::path::~path((path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      goto LAB_018fec57;
    }
  }
  fs::path::path((path *)0x18febe8,
                 (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  fs::path::operator=(in_RDI,in_stack_ffffffffffffff20);
  fs::path::~path((path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
LAB_018fec57:
  fs::path::path((path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                 (path *)0x18fec69);
  fs::operator/(p1,(char *)in_RDI);
  fs::path::~path((path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  fs::path::~path((path *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return p1;
  }
  __stack_chk_fail();
}

Assistant:

fs::path GetDefaultDataDir()
{
    // Windows:
    //   old: C:\Users\Username\AppData\Roaming\Bitcoin
    //   new: C:\Users\Username\AppData\Local\Bitcoin
    // macOS: ~/Library/Application Support/Bitcoin
    // Unix-like: ~/.bitcoin
#ifdef WIN32
    // Windows
    // Check for existence of datadir in old location and keep it there
    fs::path legacy_path = GetSpecialFolderPath(CSIDL_APPDATA) / "Bitcoin";
    if (fs::exists(legacy_path)) return legacy_path;

    // Otherwise, fresh installs can start in the new, "proper" location
    return GetSpecialFolderPath(CSIDL_LOCAL_APPDATA) / "Bitcoin";
#else
    fs::path pathRet;
    char* pszHome = getenv("HOME");
    if (pszHome == nullptr || strlen(pszHome) == 0)
        pathRet = fs::path("/");
    else
        pathRet = fs::path(pszHome);
#ifdef MAC_OSX
    // macOS
    return pathRet / "Library/Application Support/Bitcoin";
#else
    // Unix-like
    return pathRet / ".bitcoin";
#endif
#endif
}